

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.hpp
# Opt level: O0

void libtorrent::aux::
     sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::bt_peer_connection*>
               (vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                *container,bt_peer_connection *v)

{
  value_type local_40;
  const_iterator local_38;
  peer_connection **local_30;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_28;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_20;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  i;
  bt_peer_connection *v_local;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  *container_local;
  
  i._M_current = (peer_connection **)v;
  local_28._M_current =
       (peer_connection **)
       ::std::
       vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       ::begin(container);
  local_30 = (peer_connection **)
             ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::end(container);
  local_20 = ::std::
             lower_bound<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,libtorrent::aux::bt_peer_connection*>
                       (local_28,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                  )local_30,(bt_peer_connection **)&i);
  __gnu_cxx::
  __normal_iterator<libtorrent::aux::peer_connection*const*,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
  ::__normal_iterator<libtorrent::aux::peer_connection**>
            ((__normal_iterator<libtorrent::aux::peer_connection*const*,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
              *)&local_38,&local_20);
  local_40 = (value_type)i._M_current;
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  insert(container,local_38,&local_40);
  return;
}

Assistant:

void sorted_insert(std::vector<T>& container, U v)
	{
		auto i = std::lower_bound(container.begin(), container.end(), v);
		container.insert(i, v);
	}